

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall mkvmuxer::Segment::QueueFrame(Segment *this,Frame *frame)

{
  int iVar1;
  Frame **ppFVar2;
  Frame **ppFVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar1 = this->frames_capacity_;
  uVar7 = this->frames_size_;
  if ((int)uVar7 < iVar1) {
    ppFVar3 = this->frames_;
  }
  else {
    uVar6 = 2;
    if (iVar1 != 0) {
      uVar6 = iVar1 * 2;
    }
    if ((int)uVar6 < 1) {
      uVar4 = 0;
      goto LAB_0014cd87;
    }
    ppFVar3 = (Frame **)operator_new__((ulong)uVar6 << 3,(nothrow_t *)&std::nothrow);
    uVar4 = 0;
    if (ppFVar3 == (Frame **)0x0) goto LAB_0014cd87;
    ppFVar2 = this->frames_;
    uVar5 = 0;
    if (0 < (int)uVar7) {
      uVar5 = (ulong)uVar7;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      ppFVar3[uVar4] = ppFVar2[uVar4];
    }
    if (ppFVar2 != (Frame **)0x0) {
      operator_delete__(ppFVar2);
      uVar7 = this->frames_size_;
    }
    this->frames_ = ppFVar3;
    this->frames_capacity_ = uVar6;
  }
  this->frames_size_ = uVar7 + 1;
  ppFVar3[(int)uVar7] = frame;
  uVar4 = 1;
LAB_0014cd87:
  return SUB81(uVar4,0);
}

Assistant:

bool Segment::QueueFrame(Frame* frame) {
  const int32_t new_size = frames_size_ + 1;

  if (new_size > frames_capacity_) {
    // Add more frames.
    const int32_t new_capacity = (!frames_capacity_) ? 2 : frames_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    Frame** const frames = new (std::nothrow) Frame*[new_capacity];  // NOLINT
    if (!frames)
      return false;

    for (int32_t i = 0; i < frames_size_; ++i) {
      frames[i] = frames_[i];
    }

    delete[] frames_;
    frames_ = frames;
    frames_capacity_ = new_capacity;
  }

  frames_[frames_size_++] = frame;

  return true;
}